

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsContInt
          (ChElementBeamANCF_3333 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  Scalar *pSVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Matrix<double,__1,__1,_1,__1,__1> *this_00;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  local_290 [3];
  BlockImpl_dense<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false,_true> local_258;
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_NSF,_3>_conflict1 SD_precompute_D;
  MatrixNx3c Sxi_D;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  this_00 = &this->m_SD;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,9,0x2d);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&(this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0xc,
             1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&(this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,3,1)
  ;
  uVar13 = 0;
  lVar6 = DAT_011df5d0;
  while( true ) {
    lVar9 = *(long *)(lVar6 + 0x38);
    lVar16 = *(long *)(lVar6 + 0x30);
    uVar14 = (ulong)uVar13;
    if ((ulong)(lVar9 - lVar16 >> 3) <= uVar14) break;
    lVar9 = *(long *)(lVar6 + 0x18);
    lVar16 = *(long *)(lVar6 + 0x20);
    for (uVar15 = 0; uVar11 = (ulong)uVar15, uVar11 < (ulong)(lVar16 - lVar9 >> 3);
        uVar15 = uVar15 + 1) {
      uVar8 = 0;
      while( true ) {
        uVar10 = (ulong)uVar8;
        lVar16 = *(long *)(lVar6 + 0x20);
        lVar9 = *(long *)(lVar6 + 0x18);
        uVar12 = lVar16 - lVar9 >> 3;
        if (uVar12 <= uVar10) break;
        lVar16 = (uVar12 * uVar14 + uVar11) * uVar12;
        dVar1 = *(double *)(*(long *)(static_tables_3333 + 0x30) + uVar14 * 8);
        dVar2 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar11 * 8);
        dVar3 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar10 * 8);
        Calc_Sxi_D(this,&Sxi_D,*(double *)(*(long *)(lVar6 + 0x30) + uVar14 * 8),
                   *(double *)(lVar9 + uVar11 * 8),*(double *)(lVar9 + uVar10 * 8));
        local_290[0].m_lhs = (LhsNested)&this->m_ebar0;
        local_290[0].m_rhs.m_xpr = (XprTypeNested)&Sxi_D;
        local_258.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false>,_0>.m_data =
             (PointerType)&J_0xi;
        Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)&local_258,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
                    *)local_290);
        local_290[0].m_lhs = &Sxi_D;
        local_290[0].m_rhs.m_xpr = &J_0xi.super_Matrix<double,_3,_3,_1,_3,_3>;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,9,3,1,9,3>,Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
                  (&SD_precompute_D,local_290);
        auVar18._0_8_ =
             Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                       (&J_0xi.super_Matrix<double,_3,_3,_1,_3,_3>);
        auVar18._8_56_ = extraout_var;
        auVar4._8_8_ = 0x8000000000000000;
        auVar4._0_8_ = 0x8000000000000000;
        auVar17 = vxorpd_avx512vl(auVar18._0_16_,auVar4);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            &this->m_kGQ_D0,lVar16 + uVar10);
        *pSVar7 = auVar17._0_8_ * dVar1 * dVar2 * dVar3;
        Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false,_true>::
        BlockImpl_dense(&local_258,&SD_precompute_D,0);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,
                   this_00,lVar16 + uVar10);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,9,3,1,9,3>,9,1,false>>
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,
                   (Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false> *)&local_258);
        Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false,_true>::
        BlockImpl_dense(&local_258,&SD_precompute_D,1);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,
                   this_00,lVar16 + 0xc + uVar10);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,9,3,1,9,3>,9,1,false>>
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,
                   (Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false> *)&local_258);
        Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false,_true>::
        BlockImpl_dense(&local_258,&SD_precompute_D,2);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,
                   this_00,lVar16 + 0x18 + uVar10);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,9,3,1,9,3>,9,1,false>>
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,
                   (Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false> *)&local_258);
        uVar8 = uVar8 + 1;
        lVar6 = DAT_011df5d0;
      }
    }
    uVar13 = uVar13 + 1;
  }
  uVar14 = 0x2a;
  while (iVar5 = (int)uVar14, uVar11 = (ulong)(iVar5 - 0x2a), uVar11 < (ulong)(lVar9 - lVar16 >> 3))
  {
    dVar1 = *(double *)(*(long *)(static_tables_3333 + 0x30) + uVar11 * 8);
    dVar1 = dVar1 + dVar1;
    Calc_Sxi_D(this,&Sxi_D,*(double *)(lVar16 + uVar11 * 8),0.0,0.0);
    local_290[0].m_lhs = (LhsNested)&this->m_ebar0;
    local_290[0].m_rhs.m_xpr = (XprTypeNested)&Sxi_D;
    local_258.super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false>,_0>.m_data =
         (PointerType)&J_0xi;
    Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)&local_258,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
                *)local_290);
    local_290[0].m_lhs = &Sxi_D;
    local_290[0].m_rhs.m_xpr = &J_0xi.super_Matrix<double,_3,_3,_1,_3,_3>;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,3,1,9,3>,Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
              (&SD_precompute_D,local_290);
    auVar19._0_8_ =
         Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                   (&J_0xi.super_Matrix<double,_3,_3,_1,_3,_3>);
    auVar19._8_56_ = extraout_var_00;
    auVar17._8_8_ = 0x8000000000000000;
    auVar17._0_8_ = 0x8000000000000000;
    auVar17 = vxorpd_avx512vl(auVar19._0_16_,auVar17);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &this->m_kGQ_Dv,uVar11);
    *pSVar7 = auVar17._0_8_ * (dVar1 + dVar1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false,_true>::
    BlockImpl_dense(&local_258,&SD_precompute_D,0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,this_00,
               (ulong)(iVar5 - 6));
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,9,3,1,9,3>,9,1,false>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,
               (Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false> *)&local_258);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false,_true>::
    BlockImpl_dense(&local_258,&SD_precompute_D,1);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,this_00,
               (ulong)(iVar5 - 3));
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,9,3,1,9,3>,9,1,false>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,
               (Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false> *)&local_258);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false,_true>::
    BlockImpl_dense(&local_258,&SD_precompute_D,2);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,this_00,
               uVar14);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,9,3,1,9,3>,9,1,false>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_290,
               (Block<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_9,_1,_false> *)&local_258);
    lVar16 = *(long *)(DAT_011df5d0 + 0x30);
    lVar9 = *(long *)(DAT_011df5d0 + 0x38);
    uVar14 = (ulong)(iVar5 + 1);
  }
  return;
}

Assistant:

void ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsContInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = NP - 1;        // Gauss-Quadrature table index for xi
    unsigned int GQ_idx_eta_zeta = NT - 1;  // Gauss-Quadrature table index for eta and zeta

    m_SD.resize(NSF, 3 * NIP);
    m_kGQ_D0.resize(NIP_D0, 1);
    m_kGQ_Dv.resize(NIP_Dv, 1);

    ChMatrixNM<double, NSF, 3> SD_precompute_D;

    // Precalculate the matrices of normalized shape function derivatives corrected for a potentially non-straight
    // reference configuration & GQ Weights times the determinant of the element Jacobian for later use in the
    // generalized internal force and Jacobian calculations.

    // First calculate the matrices and constants for the portion of the Enhance Continuum Mechanics/Selective Reduced
    // Integration that does not include the Poisson effect.
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];
                auto index = it_zeta + it_eta * GQTable->Lroots[GQ_idx_eta_zeta].size() +
                             it_xi * GQTable->Lroots[GQ_idx_eta_zeta].size() * GQTable->Lroots[GQ_idx_eta_zeta].size();
                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                // Adjust the shape function derivative matrix to account for a potentially deformed reference state
                SD_precompute_D = Sxi_D * J_0xi.inverse();
                m_kGQ_D0(index) = -J_0xi.determinant() * GQ_weight;

                // Group all of the columns together in blocks with the shape function derivatives for the section that
                // does not include the Poisson effect at the beginning of m_SD
                m_SD.col(index) = SD_precompute_D.col(0);
                m_SD.col(index + NIP_D0) = SD_precompute_D.col(1);
                m_SD.col(index + 2 * NIP_D0) = SD_precompute_D.col(2);

                index++;
            }
        }
    }

    // Next calculate the matrices and constants for the portion of the Enhance Continuum Mechanics/Selective Reduced
    // Integration that includes the Poisson effect, but integrating across the volume of the element with one 1 point
    // GQ for the cross section directions.
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * 2 * 2;
        double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
        double eta = 0;
        double zeta = 0;
        ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
        MatrixNx3c Sxi_D;          // Matrix of normalized shape function derivatives

        Calc_Sxi_D(Sxi_D, xi, eta, zeta);
        J_0xi.noalias() = m_ebar0 * Sxi_D;

        // Adjust the shape function derivative matrix to account for a potentially deformed reference state
        SD_precompute_D = Sxi_D * J_0xi.inverse();
        m_kGQ_Dv(it_xi) = -J_0xi.determinant() * GQ_weight;

        // Group all of the columns together in blocks with the shape function derivative for the Poisson effect at the
        // end of m_SD
        m_SD.col(3 * NIP_D0 + it_xi) = SD_precompute_D.col(0);
        m_SD.col(3 * NIP_D0 + NIP_Dv + it_xi) = SD_precompute_D.col(1);
        m_SD.col(3 * NIP_D0 + 2 * NIP_Dv + it_xi) = SD_precompute_D.col(2);
    }
}